

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RowSetEntry * rowSetEntrySort(RowSetEntry *pIn)

{
  RowSetEntry *pRVar1;
  RowSetEntry *local_168;
  RowSetEntry *aBucket [40];
  RowSetEntry *pNext;
  RowSetEntry *pRStack_10;
  uint i;
  RowSetEntry *pIn_local;
  
  memset(&local_168,0,0x140);
  pRStack_10 = pIn;
  while (pRStack_10 != (RowSetEntry *)0x0) {
    pRVar1 = pRStack_10->pRight;
    pRStack_10->pRight = (RowSetEntry *)0x0;
    pNext._4_4_ = 0;
    while (aBucket[(ulong)pNext._4_4_ - 1] != (RowSetEntry *)0x0) {
      pRStack_10 = rowSetEntryMerge(aBucket[(ulong)pNext._4_4_ - 1],pRStack_10);
      aBucket[(ulong)pNext._4_4_ - 1] = (RowSetEntry *)0x0;
      pNext._4_4_ = pNext._4_4_ + 1;
    }
    aBucket[(ulong)pNext._4_4_ - 1] = pRStack_10;
    pRStack_10 = pRVar1;
  }
  pRStack_10 = (RowSetEntry *)0x0;
  for (pNext._4_4_ = 0; pNext._4_4_ < 0x28; pNext._4_4_ = pNext._4_4_ + 1) {
    pRStack_10 = rowSetEntryMerge(pRStack_10,aBucket[(ulong)pNext._4_4_ - 1]);
  }
  return pRStack_10;
}

Assistant:

static struct RowSetEntry *rowSetEntrySort(struct RowSetEntry *pIn){
  unsigned int i;
  struct RowSetEntry *pNext, *aBucket[40];

  memset(aBucket, 0, sizeof(aBucket));
  while( pIn ){
    pNext = pIn->pRight;
    pIn->pRight = 0;
    for(i=0; aBucket[i]; i++){
      pIn = rowSetEntryMerge(aBucket[i], pIn);
      aBucket[i] = 0;
    }
    aBucket[i] = pIn;
    pIn = pNext;
  }
  pIn = 0;
  for(i=0; i<sizeof(aBucket)/sizeof(aBucket[0]); i++){
    pIn = rowSetEntryMerge(pIn, aBucket[i]);
  }
  return pIn;
}